

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_coin.cpp
# Opt level: O3

int CfdGetSelectedCoinIndex
              (void *handle,void *coin_select_handle,uint32_t index,int32_t *utxo_index)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  CfdException *pCVar4;
  int32_t iVar5;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  pcVar1 = local_50 + 0x10;
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CoinSelection","");
  cfd::capi::CheckBuffer(coin_select_handle,(string *)local_50);
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (utxo_index != (int32_t *)0x0) {
    plVar2 = *(long **)((long)coin_select_handle + 0x88);
    if (plVar2 != (long *)0x0) {
      lVar3 = *plVar2;
      if (lVar3 != plVar2[1]) {
        iVar5 = -1;
        if ((ulong)index < (ulong)(plVar2[1] - lVar3 >> 2)) {
          iVar5 = *(int32_t *)(lVar3 + (ulong)index * 4);
        }
        *utxo_index = iVar5;
        return 0;
      }
    }
    local_50._0_8_ = "cfdcapi_coin.cpp";
    local_50._8_4_ = 0x1fa;
    local_50._16_8_ = "CfdGetSelectedCoinIndex";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"select coin list is empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. select coin list is empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_50);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_50._0_8_ = "cfdcapi_coin.cpp";
  local_50._8_4_ = 0x1f1;
  local_50._16_8_ = "CfdGetSelectedCoinIndex";
  cfd::core::logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"utxo index is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. utxo index is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSelectedCoinIndex(
    void* handle, void* coin_select_handle, uint32_t index,
    int32_t* utxo_index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(coin_select_handle, kPrefixCoinSelection);
    if (utxo_index == nullptr) {
      warn(CFD_LOG_SOURCE, "utxo index is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. utxo index is null.");
    }

    CfdCapiCoinSelection* buffer =
        static_cast<CfdCapiCoinSelection*>(coin_select_handle);
    if ((buffer->indexes == nullptr) || buffer->indexes->empty()) {
      warn(CFD_LOG_SOURCE, "select coin list is empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. select coin list is empty.");
    } else if (index >= buffer->indexes->size()) {
      *utxo_index = -1;
    } else {
      *utxo_index = buffer->indexes->at(index);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}